

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<double>_>::SolveSOR
          (TPZMatrix<std::complex<double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<double>_> *F,TPZFMatrix<std::complex<double>_> *result,
          TPZFMatrix<std::complex<double>_> *residual,TPZFMatrix<std::complex<double>_> *param_6,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  long *in_RSI;
  long *in_RDI;
  TPZBaseMatrix *in_R8;
  double in_XMM0_Qa;
  TPZFMatrix<std::complex<double>_> *extraout_XMM0_Qa;
  double dVar1;
  TPZFMatrix<std::complex<double>_> *extraout_XMM0_Qa_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar4 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar5 [16];
  double *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int64_t j;
  int64_t ic;
  complex<double> eqres;
  int64_t it;
  int64_t iinc;
  int64_t ilast;
  int64_t ifirst;
  int64_t i;
  int64_t c;
  int64_t r;
  complex<double> res;
  complex<double> *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  undefined1 uVar6;
  complex<double> *in_stack_fffffffffffffe70;
  int64_t in_stack_fffffffffffffe78;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffe80;
  complex<double> local_160;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined1 local_120 [16];
  undefined8 local_108;
  long local_100;
  undefined8 local_f0;
  long local_e8;
  TPZFMatrix<std::complex<double>_> *local_e0;
  undefined8 local_d8;
  complex<double> local_d0;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  int64_t local_98;
  long local_90;
  complex<double> local_88;
  complex<double> local_78;
  complex<double> local_68;
  undefined8 local_50;
  TPZFMatrix<std::complex<double>_> *local_48 [2];
  double local_38;
  TPZBaseMatrix *local_28;
  long *local_20;
  TPZBaseMatrix *local_18;
  long *local_10;
  
  if (in_R8 == in_RDX) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
  }
  else {
    local_38 = in_XMM0_Qa;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    std::complex<double>::complex(&local_68,2.0,0.0);
    uVar3 = 0;
    std::complex<double>::complex(&local_78,*in_stack_00000008,0.0);
    std::operator*(in_stack_fffffffffffffe58,(complex<double> *)0x12b5236);
    uVar2 = 0;
    local_50 = uVar3;
    std::complex<double>::complex(&local_88,1.0,0.0);
    std::operator+(in_stack_fffffffffffffe58,(complex<double> *)0x12b5275);
    local_48[0] = extraout_XMM0_Qa;
    local_48[1] = (TPZFMatrix<std::complex<double>_> *)uVar2;
    if (local_28 != (TPZBaseMatrix *)0x0) {
      dVar1 = ::Norm((TPZFMatrix<std::complex<double>_> *)
                     CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      std::complex<double>::operator=((complex<double> *)local_48,dVar1);
    }
    if (in_stack_00000010 == 0) {
      (**(code **)(*local_20 + 0x78))();
    }
    local_90 = (**(code **)(*in_RDI + 0x60))();
    local_98 = TPZBaseMatrix::Cols(local_18);
    local_a8 = 0;
    local_b0 = local_90;
    local_b8 = 1;
    if (in_stack_00000018 == -1) {
      local_a8 = local_90 + -1;
      local_b0 = -1;
      local_b8 = -1;
    }
    auVar4._0_12_ = ZEXT812(0);
    auVar4._12_4_ = 0;
    std::complex<double>::complex(&local_d0,0.0,0.0);
    local_c0 = 0;
    while( true ) {
      uVar6 = false;
      if (local_c0 < *local_10) {
        local_e0 = local_48[0];
        local_d8 = local_48[1];
        dVar1 = fabs((double)local_48[0]);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *in_stack_00000008;
        auVar4 = auVar5 & _DAT_0203e3c0;
        uVar6 = auVar4._0_8_ < dVar1;
      }
      if ((bool)uVar6 == false) break;
      std::complex<double>::operator=((complex<double> *)local_48,0.0);
      for (local_e8 = 0; local_e8 < local_98; local_e8 = local_e8 + 1) {
        for (local_a0 = local_a8; local_a0 != local_b0; local_a0 = local_b8 + local_a0) {
          (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_a0,local_e8);
          local_f0 = auVar4._0_8_;
          local_d0._M_value._8_8_ = local_f0;
          for (local_100 = 0; uVar3 = auVar4._0_8_, local_100 < local_90; local_100 = local_100 + 1)
          {
            auVar5 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_a0,local_100);
            auVar4._0_8_ = auVar5._8_8_;
            auVar4._8_8_ = extraout_XMM1_Qb;
            local_120 = auVar5;
            TPZFMatrix<std::complex<double>_>::operator()
                      (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                       (int64_t)in_stack_fffffffffffffe70);
            std::operator*(in_stack_fffffffffffffe58,(complex<double> *)0x12b5514);
            local_108 = auVar4._0_8_;
            std::complex<double>::operator-=
                      ((complex<double> *)CONCAT17(uVar6,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe58);
          }
          std::operator*(in_stack_fffffffffffffe58,(complex<double> *)0x12b5564);
          local_128 = uVar3;
          std::complex<double>::operator+=
                    ((complex<double> *)CONCAT17(uVar6,in_stack_fffffffffffffe60),
                     in_stack_fffffffffffffe58);
          uVar3 = 0;
          std::complex<double>::complex(&local_160,local_38,0.0);
          std::operator*(in_stack_fffffffffffffe58,(complex<double> *)0x12b55ad);
          local_148 = uVar3;
          (**(code **)(*in_RDI + 0x120))(in_RDI,local_a0,local_a0);
          auVar4._8_8_ = extraout_XMM1_Qb_00;
          auVar4._0_8_ = extraout_XMM1_Qa;
          std::operator/(in_stack_fffffffffffffe58,(complex<double> *)0x12b55f2);
          local_138 = auVar4._0_8_;
          TPZFMatrix<std::complex<double>_>::operator()
                    (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                     (int64_t)in_stack_fffffffffffffe70);
          std::complex<double>::operator+=
                    ((complex<double> *)CONCAT17(uVar6,in_stack_fffffffffffffe60),
                     in_stack_fffffffffffffe58);
        }
      }
      std::sqrt<double>(in_stack_fffffffffffffe70);
      local_48[1] = auVar4._0_8_;
      local_c0 = local_c0 + 1;
      in_stack_fffffffffffffe80 = extraout_XMM0_Qa_00;
      local_48[0] = extraout_XMM0_Qa_00;
    }
    if (local_28 != (TPZBaseMatrix *)0x0) {
      (**(code **)(*in_RDI + 0x140))(in_RDI,local_20,local_18,local_28);
    }
    *local_10 = local_c0;
    dVar1 = fabs((double)local_48[0]);
    *in_stack_00000008 = dVar1;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}